

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_time<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  uint16_t uVar2;
  value_type_conflict4 vVar3;
  size_t sVar4;
  value_type *pvVar5;
  error_type *this;
  error_info *v;
  basic_value<toml::type_config> *pbVar6;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  location first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  undefined1 local_3b8 [48];
  size_t local_388;
  size_t sStack_380;
  size_t local_378;
  size_t sStack_370;
  size_t local_368;
  size_t sStack_360;
  size_t local_358;
  undefined1 local_350 [48];
  size_t local_320;
  size_t sStack_318;
  size_t local_310;
  size_t sStack_308;
  size_t local_300;
  size_t sStack_2f8;
  size_t local_2f0;
  undefined1 local_2e8 [144];
  location local_258;
  undefined1 local_210 [120];
  size_t local_198;
  size_t sStack_190;
  size_t local_188;
  size_t sStack_180;
  size_t local_178;
  size_t sStack_170;
  size_t local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  basic_value<toml::type_config> local_148;
  failure<toml::error_info> local_80;
  
  location::location(&local_258,loc);
  parse_local_time_only<toml::type_config>
            ((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              *)local_2e8,loc,ctx);
  if (local_2e8[0] == false) {
    this = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                         *)local_2e8,(source_location)0x4e03e8);
    err<toml::error_info&>(&local_80,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
  }
  else {
    pvVar5 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                       *)local_2e8,(source_location)0x4e0400);
    vVar3._0_1_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
    vVar3._1_1_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
    vVar3._2_1_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
    vVar3._3_1_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
    vVar3._4_2_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
    vVar3._6_2_ = (pvVar5->
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
    uVar2 = (pvVar5->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
    pvVar5 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                       *)local_2e8,(source_location)0x4e0418);
    bVar1 = (pvVar5->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
    sVar4 = (pvVar5->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
            subsecond_precision;
    pvVar5 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                       *)local_2e8,(source_location)0x4e0430);
    local_210._72_8_ =
         (pvVar5->
         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_210._80_8_ =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(pvVar5->
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         + 8))->_M_pi;
    (pvVar5->
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = 0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(pvVar5->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Tuple_impl<2UL,_toml::detail::region>.
            super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_350._16_8_ = local_350 + 0x20;
    local_210._88_8_ =
         (pvVar5->
         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_._M_dataplus.
         _M_p;
    pbVar6 = (basic_value<toml::type_config> *)
             &(pvVar5->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
              super__Tuple_impl<2UL,_toml::detail::region>.
              super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2;
    if ((basic_value<toml::type_config> *)local_210._88_8_ == pbVar6) {
      local_350._32_8_ = *(undefined8 *)pbVar6;
      local_350._40_8_ =
           *(undefined8 *)
            ((long)&(pvVar5->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                    super__Tuple_impl<2UL,_toml::detail::region>.
                    super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                    field_2 + 8);
      local_210._88_8_ = local_350._16_8_;
    }
    else {
      local_350._32_8_ = *(undefined8 *)pbVar6;
    }
    local_210._104_8_ = local_350._32_8_;
    local_210._96_8_ =
         (pvVar5->
         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
         _M_string_length;
    (pvVar5->
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_._M_dataplus._M_p = (pointer)pbVar6;
    (pvVar5->
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_._M_string_length = 0;
    (pvVar5->
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_.field_2._M_local_buf[0] = '\0';
    local_358 = (pvVar5->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_column_;
    local_368 = (pvVar5->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_;
    sStack_360 = (pvVar5->
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_line_;
    local_378 = (pvVar5->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_line_;
    sStack_370 = (pvVar5->
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_column_;
    local_388 = (pvVar5->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.length_;
    sStack_380 = (pvVar5->
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_;
    local_350._0_8_ = (element_type *)0x0;
    local_350._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3b8._16_8_ = local_3b8 + 0x20;
    if (local_210._88_8_ == local_350._16_8_) {
      local_3b8._40_8_ = local_350._40_8_;
      local_210._88_8_ = local_3b8._16_8_;
    }
    local_350._24_8_ = 0;
    local_350._32_8_ = local_350._32_8_ & 0xffffffffffffff00;
    local_210[0] = (toml)0x8;
    local_3b8._0_8_ = (element_type *)0x0;
    local_3b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pbVar6 = (basic_value<toml::type_config> *)local_210._104_8_;
    if (local_210._88_8_ == local_3b8._16_8_) {
      local_210._112_8_ = local_3b8._40_8_;
      pbVar6 = (basic_value<toml::type_config> *)local_210._88_8_;
      local_210._88_8_ = (basic_value<toml::type_config> *)(local_210 + 0x68);
    }
    local_3b8._24_8_ = 0;
    local_3b8._32_8_ = local_210._104_8_ & 0xffffffffffffff00;
    local_160.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_320 = local_388;
    sStack_318 = sStack_380;
    local_310 = local_378;
    sStack_308 = sStack_370;
    local_300 = local_368;
    sStack_2f8 = sStack_360;
    local_2f0 = local_358;
    local_210._8_8_ = vVar3;
    local_210._16_2_ = uVar2;
    local_210[0x18] = bVar1;
    local_210._32_8_ = sVar4;
    local_198 = local_388;
    sStack_190 = sStack_380;
    local_188 = local_378;
    sStack_180 = sStack_370;
    local_178 = local_368;
    sStack_170 = sStack_360;
    local_168 = local_358;
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_148,(toml *)local_210,pbVar6
              );
    __return_storage_ptr__->is_ok_ = true;
    pbVar6 = &local_148;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,pbVar6);
    basic_value<toml::type_config>::cleanup(&local_148,(EVP_PKEY_CTX *)pbVar6);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_148.comments_);
    region::~region(&local_148.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_210,(EVP_PKEY_CTX *)pbVar6);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    region::~region((region *)(local_210 + 0x48));
    region::~region((region *)local_3b8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8);
    region::~region((region *)local_350);
  }
  if (local_2e8[0] == true) {
    region::~region((region *)(local_2e8 + 8));
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_2e8 + 8));
  }
  location::~location(&local_258);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_time(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    auto val_fmt_reg = parse_local_time_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}